

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_encode
              (secp256k1_context *ctx,uchar *ell64,secp256k1_pubkey *pubkey,uchar *rnd32)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  secp256k1_sha256 hash;
  int ser_ret;
  size_t ser_size;
  uchar p64 [64];
  secp256k1_fe t;
  secp256k1_ge p;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar2;
  secp256k1_ge *in_stack_fffffffffffffe80;
  secp256k1_context *in_stack_fffffffffffffe88;
  secp256k1_sha256 *in_stack_fffffffffffffe90;
  long local_110;
  undefined1 local_108 [240];
  void *local_18;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/main_impl.h"
            ,0x191,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    iVar1 = secp256k1_pubkey_load
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (secp256k1_pubkey *)
                       CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (iVar1 == 0) {
      memset(local_18,0,0x40);
      local_4 = 0;
    }
    else {
      memset(local_108,0,0x40);
      secp256k1_ellswift_sha256_init_encode((secp256k1_sha256 *)0x10e458);
      iVar1 = secp256k1_eckey_pubkey_serialize
                        ((secp256k1_ge *)in_stack_fffffffffffffe88,
                         (uchar *)in_stack_fffffffffffffe80,
                         (size_t *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),0);
      uVar2 = iVar1 != 0 && local_110 == 0x21;
      if (iVar1 == 0 || local_110 != 0x21) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/main_impl.h"
                ,0x1a2,"test condition failed: ser_ret && ser_size == 33");
        abort();
      }
      secp256k1_sha256_write
                (in_stack_fffffffffffffe90,(uchar *)in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80);
      secp256k1_sha256_write
                (in_stack_fffffffffffffe90,(uchar *)in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80);
      secp256k1_ellswift_elligatorswift_var
                ((uchar *)in_stack_fffffffffffffe90,(secp256k1_fe *)in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80,
                 (secp256k1_sha256 *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
      secp256k1_fe_get_b32
                ((uchar *)in_stack_fffffffffffffe80,
                 (secp256k1_fe *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ellswift_encode(const secp256k1_context *ctx, unsigned char *ell64, const secp256k1_pubkey *pubkey, const unsigned char *rnd32) {
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(rnd32 != NULL);

    if (secp256k1_pubkey_load(ctx, &p, pubkey)) {
        secp256k1_fe t;
        unsigned char p64[64] = {0};
        size_t ser_size;
        int ser_ret;
        secp256k1_sha256 hash;

        /* Set up hasher state; the used RNG is H(pubkey || "\x00"*31 || rnd32 || cnt++), using
         * BIP340 tagged hash with tag "secp256k1_ellswift_encode". */
        secp256k1_ellswift_sha256_init_encode(&hash);
        ser_ret = secp256k1_eckey_pubkey_serialize(&p, p64, &ser_size, 1);
#ifdef VERIFY
        VERIFY_CHECK(ser_ret && ser_size == 33);
#else
        (void)ser_ret;
#endif
        secp256k1_sha256_write(&hash, p64, sizeof(p64));
        secp256k1_sha256_write(&hash, rnd32, 32);

        /* Compute ElligatorSwift encoding and construct output. */
        secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
        secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */
        return 1;
    }
    /* Only reached in case the provided pubkey is invalid. */
    memset(ell64, 0, 64);
    return 0;
}